

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O2

void __thiscall deqp::egl::ApiCase::expectNoDisplay(ApiCase *this,EGLDisplay got)

{
  ostringstream *this_00;
  TestContext *this_01;
  MessageBuilder local_190;
  
  if (got != (EGLDisplay)0x0) {
    local_190.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &local_190.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"// ERROR expected: EGL_NO_DISPLAY");
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Got invalid value");
    }
  }
  return;
}

Assistant:

void ApiCase::expectNoDisplay (EGLDisplay got)
{
	if (got != EGL_NO_DISPLAY)
	{
		m_testCtx.getLog() << TestLog::Message << "// ERROR expected: EGL_NO_DISPLAY" << TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid value");
	}
}